

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rulebasedcollator.cpp
# Opt level: O1

UCollationResult __thiscall
icu_63::RuleBasedCollator::compare
          (RuleBasedCollator *this,UCharIterator *left,UCharIterator *right,UErrorCode *errorCode)

{
  CollationSettings *settings;
  CollationData *pCVar1;
  byte numeric;
  UBool UVar2;
  char cVar3;
  int c;
  int c_00;
  UChar32 c_01;
  UCollationResult UVar4;
  int iVar5;
  bool bVar6;
  UIterCollationIterator rightIter;
  UIterCollationIterator leftIter;
  undefined1 local_440 [40];
  UTrie2 *local_418;
  CollationData *local_410;
  undefined4 local_408;
  long *local_400;
  undefined4 local_3f8;
  undefined1 local_3f4;
  long local_3f0 [36];
  int32_t local_2d0;
  SkippedState *local_2c8;
  int32_t local_2c0;
  byte local_2bc;
  UCharIterator *local_2b8;
  State local_2b0;
  int32_t local_2ac;
  undefined8 local_2a8;
  Normalizer2Impl *local_2a0;
  UObject local_298;
  undefined1 local_290 [88];
  undefined1 local_238 [40];
  UTrie2 *local_210;
  CollationData *local_208;
  undefined4 local_200;
  long *local_1f8;
  undefined4 local_1f0;
  undefined1 local_1ec;
  long local_1e8 [36];
  int32_t local_c8;
  SkippedState *local_c0;
  int32_t local_b8;
  byte local_b4;
  UCharIterator *local_b0;
  State local_a8;
  int32_t local_a4;
  undefined8 local_a0;
  Normalizer2Impl *local_98;
  UObject local_90;
  undefined1 local_88 [88];
  
  UVar4 = UCOL_EQUAL;
  if ((left != right) && (UVar4 = UCOL_EQUAL, *errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    numeric = (byte)this->settings->options >> 1 & 1;
    c = (*(code *)left->next)(left);
    c_00 = (*(code *)right->next)(right);
    bVar6 = c == c_00;
    if (bVar6) {
      iVar5 = 0;
      do {
        if (c < 0) goto LAB_0021b18d;
        iVar5 = iVar5 + 1;
        c = (*(code *)left->next)(left);
        c_00 = (*(code *)right->next)(right);
        bVar6 = c == c_00;
      } while (bVar6);
    }
    else {
      iVar5 = 0;
    }
    if (-1 < c) {
      (*(code *)left->previous)(left);
    }
    if (-1 < c_00) {
      (*(code *)right->previous)(right);
    }
    if (iVar5 != 0) {
      if ((c < 0) || (UVar2 = CollationData::isUnsafeBackward(this->data,c,numeric), UVar2 == '\0'))
      {
        if (-1 < c_00) {
          cVar3 = CollationData::isUnsafeBackward(this->data,c_00,numeric);
          goto joined_r0x0021b151;
        }
      }
      else {
        do {
          c_01 = (*(code *)left->previous)(left);
          (*(code *)right->previous)();
          if (iVar5 < 2) {
            iVar5 = 0;
            break;
          }
          iVar5 = iVar5 + -1;
          cVar3 = CollationData::isUnsafeBackward(this->data,c_01,numeric);
joined_r0x0021b151:
        } while (cVar3 != '\0');
      }
    }
LAB_0021b18d:
    UVar4 = UCOL_EQUAL;
    if (!bVar6) {
      settings = this->settings;
      local_2bc = numeric;
      local_2b8 = right;
      local_b4 = numeric;
      local_b0 = left;
      if ((settings->options & 1) == 0) {
        local_440._16_8_ = this->data;
        local_238._32_8_ = &local_208;
        local_238._8_8_ = *(undefined8 *)local_440._16_8_;
        local_238._24_8_ = (ulong)(uint)local_238._28_4_ << 0x20;
        local_210 = (UTrie2 *)CONCAT35(local_210._5_3_,0x28);
        local_c8 = 0;
        local_c0 = (SkippedState *)0x0;
        local_b8 = -1;
        local_238._0_8_ = &PTR__UIterCollationIterator_003a8d50;
        local_440._32_8_ = &local_410;
        local_440._8_8_ = *(undefined8 *)local_440._16_8_;
        local_440._24_8_ = (ulong)(uint)local_440._28_4_ << 0x20;
        local_418 = (UTrie2 *)CONCAT35(local_418._5_3_,0x28);
        local_2d0 = 0;
        local_2c8 = (SkippedState *)0x0;
        local_2c0 = -1;
        local_440._0_8_ = &PTR__UIterCollationIterator_003a8d50;
        local_238._16_8_ = local_440._16_8_;
        UVar4 = CollationCompare::compareUpToQuaternary
                          ((CollationIterator *)local_238,(CollationIterator *)local_440,settings,
                           errorCode);
        UIterCollationIterator::~UIterCollationIterator((UIterCollationIterator *)local_440);
        UIterCollationIterator::~UIterCollationIterator((UIterCollationIterator *)local_238);
      }
      else {
        local_440._16_8_ = this->data;
        local_238._32_8_ = &local_208;
        local_238._8_8_ = *(undefined8 *)local_440._16_8_;
        local_238._24_8_ = (ulong)(uint)local_238._28_4_ << 0x20;
        local_210 = (UTrie2 *)CONCAT35(local_210._5_3_,0x28);
        local_c8 = 0;
        local_c0 = (SkippedState *)0x0;
        local_b8 = -1;
        local_238._0_8_ = &PTR__FCDUIterCollationIterator_003a8cc0;
        local_a8 = ITER_CHECK_FWD;
        local_98 = *(Normalizer2Impl **)(local_440._16_8_ + 0x30);
        local_90._vptr_UObject = (_func_int **)&PTR__UnicodeString_003b5258;
        local_88._0_2_ = 2;
        local_440._32_8_ = &local_410;
        local_440._8_8_ = *(undefined8 *)local_440._16_8_;
        local_440._24_8_ = (ulong)(uint)local_440._28_4_ << 0x20;
        local_418 = (UTrie2 *)CONCAT35(local_418._5_3_,0x28);
        local_2d0 = 0;
        local_2c8 = (SkippedState *)0x0;
        local_2c0 = -1;
        local_440._0_8_ = &PTR__FCDUIterCollationIterator_003a8cc0;
        local_2b0 = ITER_CHECK_FWD;
        local_2a0 = *(Normalizer2Impl **)(local_440._16_8_ + 0x30);
        local_298._vptr_UObject = (_func_int **)&PTR__UnicodeString_003b5258;
        local_290._0_2_ = 2;
        local_2ac = iVar5;
        local_238._16_8_ = local_440._16_8_;
        local_a4 = iVar5;
        UVar4 = CollationCompare::compareUpToQuaternary
                          ((CollationIterator *)local_238,(CollationIterator *)local_440,settings,
                           errorCode);
        FCDUIterCollationIterator::~FCDUIterCollationIterator
                  ((FCDUIterCollationIterator *)local_440);
        FCDUIterCollationIterator::~FCDUIterCollationIterator
                  ((FCDUIterCollationIterator *)local_238);
      }
      if (((UVar4 == UCOL_EQUAL) && (0xefff < this->settings->options)) &&
         (*errorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
        (*left->move)(left,iVar5,UITER_ZERO);
        (*right->move)(right,iVar5,UITER_ZERO);
        pCVar1 = this->data;
        if ((this->settings->options & 1) == 0) {
          local_238._24_8_ = 0xffffffff;
          local_238._0_8_ = &PTR__UObject_003a8a48;
          local_440._24_8_ = 0xffffffff;
          local_440._0_8_ = &PTR__UObject_003a8a48;
          local_440._32_8_ = right;
          local_238._32_8_ = left;
          UVar4 = anon_unknown_16::compareNFDIter
                            (pCVar1->nfcImpl,(NFDIterator *)local_238,(NFDIterator *)local_440);
          UObject::~UObject((UObject *)local_440);
        }
        else {
          local_238._24_8_ = 0xffffffff;
          local_238._0_8_ = &PTR__FCDUIterNFDIterator_003a8a90;
          local_210 = pCVar1->trie;
          local_200 = 0;
          local_1f8 = local_1e8;
          local_1f0 = 0x28;
          local_1ec = 0;
          local_a8 = ITER_CHECK_FWD;
          local_a0._0_4_ = 0;
          local_a0._4_4_ = 0;
          local_98 = (Normalizer2Impl *)CONCAT35(local_98._5_3_,0xffffffff);
          local_238._32_8_ = &PTR__FCDUIterCollationIterator_003a8cc0;
          local_88._0_4_ = 0;
          local_88._16_8_ = pCVar1->nfcImpl;
          local_88._24_8_ = &PTR__UnicodeString_003b5258;
          local_88._32_2_ = L'\x02';
          local_440._24_8_ = 0xffffffff;
          local_440._0_8_ = &PTR__FCDUIterNFDIterator_003a8a90;
          local_418 = pCVar1->trie;
          local_408 = 0;
          local_400 = local_3f0;
          local_3f8 = 0x28;
          local_3f4 = 0;
          local_2b0 = ITER_CHECK_FWD;
          local_2a8._0_4_ = 0;
          local_2a8._4_4_ = 0;
          local_2a0 = (Normalizer2Impl *)CONCAT35(local_2a0._5_3_,0xffffffff);
          local_440._32_8_ = &PTR__FCDUIterCollationIterator_003a8cc0;
          local_290._0_4_ = 0;
          local_290._16_8_ = pCVar1->nfcImpl;
          local_290._24_8_ = &PTR__UnicodeString_003b5258;
          local_290._32_2_ = L'\x02';
          local_410 = pCVar1;
          local_298._vptr_UObject = (_func_int **)right;
          local_290._4_4_ = iVar5;
          local_208 = pCVar1;
          local_90._vptr_UObject = (_func_int **)left;
          local_88._4_4_ = iVar5;
          UVar4 = anon_unknown_16::compareNFDIter
                            (pCVar1->nfcImpl,(NFDIterator *)local_238,(NFDIterator *)local_440);
          local_440._0_8_ = &PTR__FCDUIterNFDIterator_003a8a90;
          FCDUIterCollationIterator::~FCDUIterCollationIterator
                    ((FCDUIterCollationIterator *)(local_440 + 0x20));
          UObject::~UObject((UObject *)local_440);
          local_238._0_8_ = &PTR__FCDUIterNFDIterator_003a8a90;
          FCDUIterCollationIterator::~FCDUIterCollationIterator
                    ((FCDUIterCollationIterator *)(local_238 + 0x20));
        }
        UObject::~UObject((UObject *)local_238);
      }
    }
  }
  return UVar4;
}

Assistant:

UCollationResult
RuleBasedCollator::compare(UCharIterator &left, UCharIterator &right,
                           UErrorCode &errorCode) const {
    if(U_FAILURE(errorCode) || &left == &right) { return UCOL_EQUAL; }
    UBool numeric = settings->isNumeric();

    // Identical-prefix test.
    int32_t equalPrefixLength = 0;
    {
        UChar32 leftUnit;
        UChar32 rightUnit;
        while((leftUnit = left.next(&left)) == (rightUnit = right.next(&right))) {
            if(leftUnit < 0) { return UCOL_EQUAL; }
            ++equalPrefixLength;
        }

        // Back out the code units that differed, for the real collation comparison.
        if(leftUnit >= 0) { left.previous(&left); }
        if(rightUnit >= 0) { right.previous(&right); }

        if(equalPrefixLength > 0) {
            if((leftUnit >= 0 && data->isUnsafeBackward(leftUnit, numeric)) ||
                    (rightUnit >= 0 && data->isUnsafeBackward(rightUnit, numeric))) {
                // Identical prefix: Back up to the start of a contraction or reordering sequence.
                do {
                    --equalPrefixLength;
                    leftUnit = left.previous(&left);
                    right.previous(&right);
                } while(equalPrefixLength > 0 && data->isUnsafeBackward(leftUnit, numeric));
            }
            // See the notes in the UTF-16 version.
        }
    }

    UCollationResult result;
    if(settings->dontCheckFCD()) {
        UIterCollationIterator leftIter(data, numeric, left);
        UIterCollationIterator rightIter(data, numeric, right);
        result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
    } else {
        FCDUIterCollationIterator leftIter(data, numeric, left, equalPrefixLength);
        FCDUIterCollationIterator rightIter(data, numeric, right, equalPrefixLength);
        result = CollationCompare::compareUpToQuaternary(leftIter, rightIter, *settings, errorCode);
    }
    if(result != UCOL_EQUAL || settings->getStrength() < UCOL_IDENTICAL || U_FAILURE(errorCode)) {
        return result;
    }

    // Compare identical level.
    left.move(&left, equalPrefixLength, UITER_ZERO);
    right.move(&right, equalPrefixLength, UITER_ZERO);
    const Normalizer2Impl &nfcImpl = data->nfcImpl;
    if(settings->dontCheckFCD()) {
        UIterNFDIterator leftIter(left);
        UIterNFDIterator rightIter(right);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    } else {
        FCDUIterNFDIterator leftIter(data, left, equalPrefixLength);
        FCDUIterNFDIterator rightIter(data, right, equalPrefixLength);
        return compareNFDIter(nfcImpl, leftIter, rightIter);
    }
}